

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int l)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    TiledOutputFile::writeTile(this->_outputFile,dx,dy,l);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    ToYa::writeTile(this->_toYa,dx,dy,l,l);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int l)
{
    if (_toYa)
    {
	Lock lock (*_toYa);
	_toYa->writeTile (dx, dy, l, l);
    }
    else
    {
	 _outputFile->writeTile (dx, dy, l);
    }
}